

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
* __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::FindHelper<long>
          (pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,long *k,TreeIterator *it)

{
  ulong uVar1;
  void **ppvVar2;
  Node *pNVar3;
  TreeIterator tree_it;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  uint uVar6;
  unsigned_long index;
  
  uVar1 = *k;
  uVar6 = (uint)((this->seed_ ^ uVar1) * -0x61c8864680b583eb >> 0x20) & (int)this->num_buckets_ - 1U
  ;
  index = (unsigned_long)uVar6;
  ppvVar2 = this->table_;
  pNVar3 = (Node *)ppvVar2[index];
  if (pNVar3 != (Node *)0x0) {
    if (pNVar3 == (Node *)ppvVar2[index ^ 1]) {
      index = (unsigned_long)(uVar6 & 0xfffffffe);
      p_Var5 = *(_Base_ptr *)((long)ppvVar2[index] + 0x18);
      if (p_Var5 != (_Base_ptr)0x0) {
        p_Var4 = (_Base_ptr)((long)ppvVar2[index] + 0x10);
        tree_it._M_node = p_Var4;
        do {
          if ((long)uVar1 <= *(long *)(p_Var5 + 1)) {
            tree_it._M_node = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(long *)(p_Var5 + 1) < (long)uVar1];
        } while (p_Var5 != (_Base_ptr)0x0);
        if ((tree_it._M_node != p_Var4) && (*(long *)(tree_it._M_node + 1) <= (long)uVar1)) {
          if (it != (TreeIterator *)0x0) {
            it->_M_node = (_Base_ptr)tree_it;
          }
          iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::iterator_base(&__return_storage_ptr__->first,tree_it,this,index);
          goto LAB_001eda85;
        }
      }
    }
    else {
      do {
        if (*(ulong *)pNVar3 == uVar1) {
          (__return_storage_ptr__->first).node_ = pNVar3;
          (__return_storage_ptr__->first).m_ = this;
          (__return_storage_ptr__->first).bucket_index_ = index;
          goto LAB_001eda85;
        }
        pNVar3 = pNVar3->next;
      } while (pNVar3 != (Node *)0x0);
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_001eda85:
  __return_storage_ptr__->second = index;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const K& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (internal::TransparentSupport<Key>::Equals(node->kv.first, k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != nullptr);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        auto tree_it = tree->find(k);
        if (tree_it != tree->end()) {
          if (it != nullptr) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }